

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O0

FMOD_RESULT
XPMP2::SoundSystemFMOD::ChnCB
          (FMOD_CHANNELCONTROL *channelcontrol,FMOD_CHANNELCONTROL_TYPE controltype,
          FMOD_CHANNELCONTROL_CALLBACK_TYPE callbacktype,void *param_4,void *param_5)

{
  SoundSystem *this;
  int in_EDX;
  int in_ESI;
  uint64_t in_RDI;
  SoundSystem *in_R8;
  SoundChannel *pChn;
  uint64_t sndId;
  FMOD_CHANNEL *pFmodChn;
  FMOD_CHANNEL *in_stack_000000c0;
  uint64_t in_stack_ffffffffffffffb8;
  FMOD_RESULT local_4;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    if (me == 0) {
      local_4 = FMOD_ERR_INTERNAL;
    }
    else {
      GetSndId(in_stack_000000c0);
      this = (SoundSystem *)SoundSystem::GetChn(in_R8,in_RDI);
      if (this != (SoundSystem *)0x0) {
        this->_vptr_SoundSystem = (_func_int **)0x0;
      }
      SoundSystem::RemoveChn(this,in_stack_ffffffffffffffb8);
      local_4 = FMOD_OK;
    }
  }
  else {
    local_4 = FMOD_OK;
  }
  return local_4;
}

Assistant:

FMOD_RESULT F_CALLBACK SoundSystemFMOD::ChnCB(FMOD_CHANNELCONTROL *channelcontrol,
                                              FMOD_CHANNELCONTROL_TYPE controltype,
                                              FMOD_CHANNELCONTROL_CALLBACK_TYPE callbacktype,
                                              void *, void *)
{
    // We are only interested in "end of channel" events
    if (controltype != FMOD_CHANNELCONTROL_CHANNEL ||
        callbacktype != FMOD_CHANNELCONTROL_CALLBACK_END)
        return FMOD_OK;
    if (!me) return FMOD_ERR_INTERNAL;

    // The sound has stop, remove it from the tracking
    FMOD_CHANNEL* pFmodChn = (FMOD_CHANNEL*)channelcontrol;
    uint64_t sndId = GetSndId(pFmodChn);
    SoundChannel* pChn = me->GetChn(sndId);
    if (pChn) pChn->pChn = nullptr;                 // Sound has stopped already, no need to stop again during destruction
    me->RemoveChn(sndId);
    return FMOD_OK;
}